

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::CreateFromAbsoluteDisplayDensity
          (ON_SubDDisplayParameters *__return_storage_ptr__,uint absolute_subd_display_density)

{
  double dVar1;
  
  if (6 < absolute_subd_display_density) {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
               ,0xf56,"","absolute_subd_display_density parameter is too large.");
    absolute_subd_display_density = 4;
  }
  __return_storage_ptr__->m_terminator = (ON_Terminator *)0x0;
  __return_storage_ptr__->m_progress_reporter = (ON_ProgressReporter *)0x0;
  __return_storage_ptr__->m_reserved6 = 0;
  __return_storage_ptr__->m_reserved7 = 0.0;
  __return_storage_ptr__->m_bDisplayDensityIsAbsolute = false;
  __return_storage_ptr__->m_display_density = '\0';
  __return_storage_ptr__->m_reserved = 0;
  __return_storage_ptr__->m_bControlNetMesh = false;
  __return_storage_ptr__->m_context = Unknown;
  __return_storage_ptr__->m_bComputeCurvature = false;
  __return_storage_ptr__->m_reserved3 = '\0';
  __return_storage_ptr__->m_reserved4 = 0;
  dVar1 = ON_Interval::ZeroToOne.m_t[1];
  __return_storage_ptr__->m_reserved5 = 0;
  (__return_storage_ptr__->m_progress_reporter_interval).m_t[0] = ON_Interval::ZeroToOne.m_t[0];
  (__return_storage_ptr__->m_progress_reporter_interval).m_t[1] = dVar1;
  __return_storage_ptr__->m_display_density = (uchar)absolute_subd_display_density;
  __return_storage_ptr__->m_bDisplayDensityIsAbsolute = true;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::CreateFromAbsoluteDisplayDensity(
  unsigned int absolute_subd_display_density
  )
{
  if (absolute_subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
  {
    ON_SUBD_ERROR("absolute_subd_display_density parameter is too large.");
    absolute_subd_display_density = ON_SubDDisplayParameters::DefaultDensity;
  }

  ON_SubDDisplayParameters limit_mesh_parameters;
  limit_mesh_parameters.m_display_density = (unsigned char)absolute_subd_display_density;
  limit_mesh_parameters.m_bDisplayDensityIsAbsolute = true;
  return limit_mesh_parameters;
}